

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

bool __thiscall capnp::Type::operator==(Type *this,Type *other)

{
  bool local_32;
  bool local_31;
  Type *other_local;
  Type *this_local;
  
  if ((this->baseType == other->baseType) && (this->listDepth == other->listDepth)) {
    switch(this->baseType) {
    case VOID:
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case FLOAT32:
    case FLOAT64:
    case TEXT:
    case DATA:
      this_local._7_1_ = true;
      break;
    case LIST:
      kj::_::unreachable();
    case ENUM:
    case STRUCT:
    case INTERFACE:
      this_local._7_1_ = (this->field_4).schema == (other->field_4).schema;
      break;
    case ANY_POINTER:
      local_31 = false;
      if (((this->field_4).schema == (other->field_4).schema) &&
         (local_31 = false, (this->isImplicitParam & 1U) == (other->isImplicitParam & 1U))) {
        if (((this->field_4).schema == (RawBrandedSchema *)0x0) &&
           ((this->isImplicitParam & 1U) == 0)) {
          local_32 = (this->field_3).paramIndex == (other->field_3).paramIndex;
        }
        else {
          local_32 = (this->field_3).paramIndex == (other->field_3).paramIndex;
        }
        local_31 = local_32;
      }
      this_local._7_1_ = local_31;
      break;
    default:
      kj::_::unreachable();
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Type::operator==(const Type& other) const {
  if (baseType != other.baseType || listDepth != other.listDepth) {
    return false;
  }

  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return true;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      return schema == other.schema;

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER:
      return scopeId == other.scopeId && isImplicitParam == other.isImplicitParam &&
          // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
          // both branches compile to the same instructions and can optimize it away.
          (scopeId != 0 || isImplicitParam ? paramIndex == other.paramIndex
                                           : anyPointerKind == other.anyPointerKind);
  }

  KJ_UNREACHABLE;
}